

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_queryiv(NegativeTestContext *ctx)

{
  GLint params;
  GLint local_3c;
  string local_38;
  
  local_3c = -1;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetQueryiv(&ctx->super_CallLogWrapper,0x8c2f,0xffffffff,&local_3c);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetQueryiv(&ctx->super_CallLogWrapper,0xffffffff,0x8865,&local_3c);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetQueryiv(&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,&local_3c);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_queryiv (NegativeTestContext& ctx)
{
	GLint params = -1;

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetQueryiv	(GL_ANY_SAMPLES_PASSED, -1, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.glGetQueryiv	(-1, GL_CURRENT_QUERY, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.glGetQueryiv	(-1, -1, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();
}